

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
::rebalance_right_to_left
          (btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
           *this,int to_move,
          btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
          *right,allocator_type *alloc)

{
  undefined8 *puVar1;
  ulong uVar2;
  bool bVar3;
  undefined8 uVar4;
  btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
  bVar5;
  long lVar6;
  long lVar7;
  char *__function;
  btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
  *pbVar8;
  int iVar9;
  int iVar10;
  
  if ((((ulong)this & 7) == 0) && (((ulong)right & 7) == 0)) {
    uVar2 = *(ulong *)this;
    if (uVar2 != *(ulong *)right) {
      __assert_fail("parent() == right->parent()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x5fc,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>]"
                   );
    }
    if ((byte)this[8] + 1 != (uint)(byte)right[8]) {
      __assert_fail("position() + 1 == right->position()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x5fd,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>]"
                   );
    }
    bVar5 = this[10];
    if ((byte)right[10] < (byte)bVar5) {
      __assert_fail("right->count() >= count()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x5fe,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>]"
                   );
    }
    if (to_move < 1) {
      __assert_fail("to_move >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x5ff,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>]"
                   );
    }
    if ((int)(uint)(byte)right[10] < to_move) {
      __assert_fail("to_move <= right->count()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x600,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>]"
                   );
    }
    if ((uVar2 & 7) == 0) {
      puVar1 = (undefined8 *)(uVar2 + 0x10 + (ulong)(byte)this[8] * 0x10);
      uVar4 = puVar1[1];
      *(undefined8 *)(this + (ulong)(byte)bVar5 * 0x10 + 0x10) = *puVar1;
      *(undefined8 *)(this + (ulong)(byte)bVar5 * 0x10 + 0x10 + 8) = uVar4;
      uninitialized_move_n(right,(ulong)(to_move - 1U),0,(ulong)(byte)bVar5 + 1,this,alloc);
      if ((*(ulong *)this & 7) == 0) {
        uVar4 = *(undefined8 *)(right + (long)(int)(to_move - 1U) * 0x10 + 0x10 + 8);
        puVar1 = (undefined8 *)(*(ulong *)this + 0x10 + (ulong)(byte)this[8] * 0x10);
        *puVar1 = *(undefined8 *)(right + (long)(int)(to_move - 1U) * 0x10 + 0x10);
        puVar1[1] = uVar4;
        if ((ulong)(uint)to_move != (ulong)(byte)right[10]) {
          pbVar8 = right + 0x10;
          lVar6 = (ulong)(uint)to_move * 0x10;
          lVar7 = (ulong)(byte)right[10] << 4;
          do {
            uVar4 = *(undefined8 *)(pbVar8 + lVar6 + 8);
            *(undefined8 *)pbVar8 = *(undefined8 *)(pbVar8 + lVar6);
            *(undefined8 *)(pbVar8 + 8) = uVar4;
            pbVar8 = pbVar8 + 0x10;
            lVar7 = lVar7 + -0x10;
          } while (lVar6 != lVar7);
        }
        if (this[0xb] ==
            (btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
             )0x0) {
          iVar10 = 1;
          if (1 < to_move) {
            iVar10 = to_move;
          }
          iVar9 = 0;
          do {
            bVar5 = this[10];
            pbVar8 = child(right,iVar9);
            init_child(this,iVar9 + (uint)(byte)bVar5 + 1,pbVar8);
            iVar9 = iVar9 + 1;
          } while (iVar10 != iVar9);
          if (to_move <= (int)(uint)(byte)right[10]) {
            iVar10 = 0;
            do {
              iVar9 = to_move + iVar10;
              bVar5 = right[0xb];
              if (right[0xb] ==
                  (btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
                   )0x0) {
                bVar5 = (btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
                         )0xf;
              }
              if ((int)(uint)(byte)bVar5 < iVar9) {
                __assert_fail("i + to_move <= right->max_count()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                              ,0x618,
                              "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>]"
                             );
              }
              pbVar8 = child(right,iVar9);
              init_child(right,iVar10,pbVar8);
              mutable_child(right,iVar9);
              bVar3 = iVar10 < (int)((uint)(byte)right[10] - to_move);
              iVar10 = iVar10 + 1;
            } while (bVar3);
          }
        }
        this[10] = (btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
                    )((char)this[10] + (char)to_move);
        right[10] = (btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
                     )((char)right[10] - (char)to_move);
        return;
      }
    }
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
    ;
  }
  else {
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,__function);
}

Assistant:

void btree_node<P>::rebalance_right_to_left(const int to_move,
                                            btree_node *right,
                                            allocator_type *alloc) {
  assert(parent() == right->parent());
  assert(position() + 1 == right->position());
  assert(right->count() >= count());
  assert(to_move >= 1);
  assert(to_move <= right->count());

  // 1) Move the delimiting value in the parent to the left node.
  value_init(count(), alloc, parent()->slot(position()));

  // 2) Move the (to_move - 1) values from the right node to the left node.
  right->uninitialized_move_n(to_move - 1, 0, count() + 1, this, alloc);

  // 3) Move the new delimiting value to the parent from the right node.
  slot_type::move(alloc, right->slot(to_move - 1), parent()->slot(position()));

  // 4) Shift the values in the right node to their correct position.
  slot_type::move(alloc, right->slot(to_move), right->slot(right->count()),
                  right->slot(0));

  // 5) Destroy the now-empty to_move entries in the right node.
  right->value_destroy_n(right->count() - to_move, to_move, alloc);

  if (!leaf()) {
    // Move the child pointers from the right to the left node.
    for (int i = 0; i < to_move; ++i) {
      init_child(count() + i + 1, right->child(i));
    }
    for (int i = 0; i <= right->count() - to_move; ++i) {
      assert(i + to_move <= right->max_count());
      right->init_child(i, right->child(i + to_move));
      right->clear_child(i + to_move);
    }
  }

  // Fixup the counts on the left and right nodes.
  set_count(count() + to_move);
  right->set_count(right->count() - to_move);
}